

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPListener.cpp
# Opt level: O2

int __thiscall
TCPListener::accept(TCPListener *this,int __fd,sockaddr *__addr,socklen_t *__addr_len)

{
  int iVar1;
  int *piVar2;
  TCPListenerError *pTVar3;
  undefined4 in_register_00000034;
  allocator local_7d;
  socklen_t remoteAddressLength;
  TCPSocket local_78;
  Address remoteAddress;
  string local_60;
  string local_40;
  
  if (this->listening == false) {
    pTVar3 = (TCPListenerError *)__cxa_allocate_exception(0x30,CONCAT44(in_register_00000034,__fd));
    std::__cxx11::string::string
              ((string *)&local_40,"Could not accept while TCPListener is not listening",
               (allocator *)&remoteAddress);
    TCPListenerError::TCPListenerError(pTVar3,&local_40,0);
    __cxa_throw(pTVar3,&TCPListenerError::typeinfo,TCPListenerError::~TCPListenerError);
  }
  iVar1 = accept4((this->super_Socket).socketDescriptor,(sockaddr *)&remoteAddress,
                  &remoteAddressLength,0);
  if (-1 < iVar1) {
    TCPSocket::TCPSocket(&local_78,iVar1);
    return local_78.super_Socket.socketDescriptor;
  }
  piVar2 = __errno_location();
  iVar1 = *piVar2;
  pTVar3 = (TCPListenerError *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string((string *)&local_60,"Could not accept connection",&local_7d);
  TCPListenerError::TCPListenerError(pTVar3,&local_60,iVar1);
  __cxa_throw(pTVar3,&TCPListenerError::typeinfo,TCPListenerError::~TCPListenerError);
}

Assistant:

TCPSocket TCPListener::accept()
{
    if(!listening){
        throw TCPListenerError("Could not accept while TCPListener is not listening");
    }

    socklen_t remoteAddressLength;
    Address remoteAddress;
    int newSocketDescriptor = ::accept4(socketDescriptor, (sockaddr*)&remoteAddress, &remoteAddressLength, 0);

    if(newSocketDescriptor < 0)
    {
        int x = errno;
        throw TCPListenerError("Could not accept connection", x);
    }
    else
    {
        return TCPSocket(newSocketDescriptor);
    }
}